

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::AggressiveDCEPass::InitializeModuleScopeLiveInstructions(AggressiveDCEPass *this)

{
  DefUseManager *pDVar1;
  pointer pOVar2;
  uint **ppuVar3;
  Instruction *pIVar4;
  byte bVar5;
  bool bVar6;
  char cVar7;
  uint32_t uVar8;
  CommonDebugInfoInstructions CVar9;
  NonSemanticShaderDebugInfo100Instructions_conflict NVar10;
  Instruction *pIVar11;
  Instruction *pIVar12;
  byte bVar13;
  uint **ppuVar14;
  uint uVar15;
  Module *pMVar16;
  uint uVar17;
  Instruction *exec;
  pointer pOVar18;
  IRContext *pIVar19;
  AggressiveDCEPass **local_78;
  undefined8 local_70;
  code *local_68;
  code *local_60;
  uint *local_58;
  AggressiveDCEPass *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  
  pIVar19 = (this->super_MemPass).super_Pass.context_;
  pMVar16 = (pIVar19->module_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar4 = (Instruction *)
           ((long)&(pMVar16->execution_modes_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  pIVar12 = *(Instruction **)
             ((long)&(pMVar16->execution_modes_).super_IntrusiveList<spvtools::opt::Instruction> +
             0x10);
  if (pIVar12 != pIVar4) {
    do {
      AddToWorklist(this,pIVar12);
      pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar12 != pIVar4);
    pIVar19 = (this->super_MemPass).super_Pass.context_;
    pMVar16 = (pIVar19->module_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
              .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  }
  pIVar4 = &(pMVar16->entry_points_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar12 = *(Instruction **)
             ((long)&(pMVar16->entry_points_).super_IntrusiveList<spvtools::opt::Instruction>.
                     sentinel_ + 8);
  if (pIVar12 != pIVar4) {
    do {
      if (this->preserve_interface_ == false) {
        if (pIVar12->unique_id_ == 0) {
          __assert_fail("unique_id_ != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                        ,0xfb,"uint32_t spvtools::opt::Instruction::unique_id() const");
        }
        utils::BitVector::Set(&this->live_insts_,pIVar12->unique_id_);
        pIVar19 = (this->super_MemPass).super_Pass.context_;
        if ((pIVar19->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar19);
        }
        pDVar1 = (pIVar19->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl;
        uVar15 = (pIVar12->has_result_id_ & 1) + 1;
        if (pIVar12->has_type_id_ == false) {
          uVar15 = (uint)pIVar12->has_result_id_;
        }
        uVar8 = Instruction::GetSingleWordOperand(pIVar12,uVar15 + 1);
        pIVar11 = analysis::DefUseManager::GetDef(pDVar1,uVar8);
        AddToWorklist(this,pIVar11);
        bVar5 = pIVar12->has_type_id_;
        bVar13 = pIVar12->has_result_id_;
        uVar15 = (bVar13 & 1) + 1;
        if ((bool)bVar5 == false) {
          uVar15 = (uint)bVar13;
        }
        if (3 < (int)((ulong)((long)(pIVar12->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pIVar12->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
                uVar15) {
          uVar15 = 3;
          do {
            pIVar19 = (this->super_MemPass).super_Pass.context_;
            if ((pIVar19->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
              IRContext::BuildDefUseManager(pIVar19);
              bVar5 = pIVar12->has_type_id_;
              bVar13 = pIVar12->has_result_id_;
            }
            pDVar1 = (pIVar19->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl;
            uVar17 = (bVar13 & 1) + 1;
            if ((bVar5 & 1) == 0) {
              uVar17 = (uint)bVar13;
            }
            uVar8 = Instruction::GetSingleWordOperand(pIVar12,uVar17 + uVar15);
            pIVar11 = analysis::DefUseManager::GetDef(pDVar1,uVar8);
            uVar8 = (pIVar11->has_result_id_ & 1) + 1;
            if (pIVar11->has_type_id_ == false) {
              uVar8 = (uint)pIVar11->has_result_id_;
            }
            uVar8 = Instruction::GetSingleWordOperand(pIVar11,uVar8);
            if ((uVar8 == 3) && (this->remove_outputs_ == false)) {
              AddToWorklist(this,pIVar11);
            }
            uVar15 = uVar15 + 1;
            bVar5 = pIVar12->has_type_id_;
            bVar13 = pIVar12->has_result_id_;
            uVar17 = (bVar13 & 1) + 1;
            if ((bool)bVar5 == false) {
              uVar17 = (uint)bVar13;
            }
          } while (uVar15 < (int)((ulong)((long)(pIVar12->operands_).
                                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(pIVar12->operands_).
                                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                            -0x55555555 - uVar17);
        }
      }
      else {
        AddToWorklist(this,pIVar12);
      }
      pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar12 != pIVar4);
    pIVar19 = (this->super_MemPass).super_Pass.context_;
    pMVar16 = (pIVar19->module_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
              .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  }
  pIVar4 = &(pMVar16->annotations_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar12 = *(Instruction **)
             ((long)&(pMVar16->annotations_).super_IntrusiveList<spvtools::opt::Instruction>.
                     sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8);
  if (pIVar12 != pIVar4) {
    do {
      if (pIVar12->opcode_ == OpDecorate) {
        uVar15 = (pIVar12->has_result_id_ & 1) + 1;
        if (pIVar12->has_type_id_ == false) {
          uVar15 = (uint)pIVar12->has_result_id_;
        }
        uVar8 = Instruction::GetSingleWordOperand(pIVar12,uVar15 + 1);
        if (uVar8 == 0xb) {
          uVar15 = (pIVar12->has_result_id_ & 1) + 1;
          if (pIVar12->has_type_id_ == false) {
            uVar15 = (uint)pIVar12->has_result_id_;
          }
          uVar8 = Instruction::GetSingleWordOperand(pIVar12,uVar15 + 2);
          if (uVar8 == 0x19) {
            AddToWorklist(this,pIVar12);
          }
        }
        if (((this->super_MemPass).super_Pass.context_)->preserve_bindings_ == true) {
          uVar15 = (pIVar12->has_result_id_ & 1) + 1;
          if (pIVar12->has_type_id_ == false) {
            uVar15 = (uint)pIVar12->has_result_id_;
          }
          uVar8 = Instruction::GetSingleWordOperand(pIVar12,uVar15 + 1);
          if (uVar8 != 0x22) {
            uVar15 = (pIVar12->has_result_id_ & 1) + 1;
            if (pIVar12->has_type_id_ == false) {
              uVar15 = (uint)pIVar12->has_result_id_;
            }
            uVar8 = Instruction::GetSingleWordOperand(pIVar12,uVar15 + 1);
            if (uVar8 != 0x21) goto LAB_0051f872;
          }
          AddToWorklist(this,pIVar12);
        }
LAB_0051f872:
        if (((this->super_MemPass).super_Pass.context_)->preserve_spec_constants_ == true) {
          uVar15 = (pIVar12->has_result_id_ & 1) + 1;
          if (pIVar12->has_type_id_ == false) {
            uVar15 = (uint)pIVar12->has_result_id_;
          }
          uVar8 = Instruction::GetSingleWordOperand(pIVar12,uVar15 + 1);
          if (uVar8 == 1) {
            AddToWorklist(this,pIVar12);
          }
        }
      }
      pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar12 != pIVar4);
    pIVar19 = (this->super_MemPass).super_Pass.context_;
    pMVar16 = (pIVar19->module_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
              .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  }
  pIVar12 = *(Instruction **)
             ((long)&(pMVar16->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>.
                     sentinel_ + 8);
  pIVar4 = &(pMVar16->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
  ;
  if (pIVar12 != pIVar4) {
    bVar6 = false;
    do {
      while (CVar9 = Instruction::GetCommonDebugOpcode(pIVar12),
            CVar9 != CommonDebugInfoDebugGlobalVariable) {
        pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        if (pIVar12 == pIVar4) {
          pIVar19 = (this->super_MemPass).super_Pass.context_;
          if (!bVar6) goto LAB_0051fa1d;
          goto LAB_0051f9f0;
        }
      }
      local_48 = 0;
      local_38 = std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:663:21)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:663:21)>
                 ::_M_manager;
      local_70 = 0;
      local_78 = &local_50;
      local_60 = std::
                 _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
                 ::_M_invoke;
      local_68 = std::
                 _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
                 ::_M_manager;
      pOVar18 = (pIVar12->operands_).
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pOVar2 = (pIVar12->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      local_50 = this;
      if (pOVar18 == pOVar2) {
LAB_0051f9a4:
        (*local_68)(&local_78,&local_78,3);
      }
      else {
        do {
          bVar6 = spvIsInIdType(pOVar18->type);
          if (bVar6) {
            ppuVar3 = (uint **)(pOVar18->words).large_data_._M_t.
                               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                               ._M_head_impl;
            ppuVar14 = &(pOVar18->words).small_data_;
            if (ppuVar3 != (uint **)0x0) {
              ppuVar14 = ppuVar3;
            }
            local_58 = *ppuVar14;
            if (local_68 == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            cVar7 = (*local_60)(&local_78,&local_58);
            if (cVar7 == '\0') break;
          }
          pOVar18 = pOVar18 + 1;
        } while (pOVar18 != pOVar2);
        if (local_68 != (code *)0x0) goto LAB_0051f9a4;
      }
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,3);
      }
      pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      bVar6 = true;
    } while (pIVar12 != pIVar4);
    pIVar19 = (this->super_MemPass).super_Pass.context_;
LAB_0051f9f0:
    if ((pIVar19->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
      IRContext::BuildDebugInfoManager(pIVar19);
    }
    pIVar12 = analysis::DebugInfoManager::GetDebugInfoNone
                        ((pIVar19->debug_info_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
                         _M_head_impl);
    AddToWorklist(this,pIVar12);
    pIVar19 = (this->super_MemPass).super_Pass.context_;
  }
LAB_0051fa1d:
  pMVar16 = (pIVar19->module_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar12 = *(Instruction **)
             ((long)&(pMVar16->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>
             + 0x10);
  do {
    if (pIVar12 ==
        (Instruction *)
        ((long)&(pMVar16->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)
       ) {
      return;
    }
    NVar10 = Instruction::GetShader100DebugOpcode(pIVar12);
    if ((int)NVar10 < 0x66) {
      if ((NVar10 == NonSemanticShaderDebugInfo100DebugCompilationUnit) ||
         (NVar10 == NonSemanticShaderDebugInfo100DebugSource)) {
LAB_0051fa57:
        AddToWorklist(this,pIVar12);
      }
    }
    else if ((NVar10 == NonSemanticShaderDebugInfo100DebugEntryPoint) ||
            (NVar10 == NonSemanticShaderDebugInfo100DebugSourceContinued)) goto LAB_0051fa57;
    pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while( true );
}

Assistant:

void AggressiveDCEPass::InitializeModuleScopeLiveInstructions() {
  // Keep all execution modes.
  for (auto& exec : get_module()->execution_modes()) {
    AddToWorklist(&exec);
  }
  // Keep all entry points.
  for (auto& entry : get_module()->entry_points()) {
    if (!preserve_interface_) {
      live_insts_.Set(entry.unique_id());
      // The actual function is live always.
      AddToWorklist(
          get_def_use_mgr()->GetDef(entry.GetSingleWordInOperand(1u)));
      for (uint32_t i = 3; i < entry.NumInOperands(); ++i) {
        auto* var = get_def_use_mgr()->GetDef(entry.GetSingleWordInOperand(i));
        auto storage_class = var->GetSingleWordInOperand(0u);
        // Vulkan support outputs without an associated input, but not inputs
        // without an associated output. Don't remove outputs unless explicitly
        // allowed.
        if (!remove_outputs_ &&
            spv::StorageClass(storage_class) == spv::StorageClass::Output) {
          AddToWorklist(var);
        }
      }
    } else {
      AddToWorklist(&entry);
    }
  }
  for (auto& anno : get_module()->annotations()) {
    if (anno.opcode() == spv::Op::OpDecorate) {
      // Keep workgroup size.
      if (spv::Decoration(anno.GetSingleWordInOperand(1u)) ==
              spv::Decoration::BuiltIn &&
          spv::BuiltIn(anno.GetSingleWordInOperand(2u)) ==
              spv::BuiltIn::WorkgroupSize) {
        AddToWorklist(&anno);
      }

      if (context()->preserve_bindings()) {
        // Keep all bindings.
        if ((spv::Decoration(anno.GetSingleWordInOperand(1u)) ==
             spv::Decoration::DescriptorSet) ||
            (spv::Decoration(anno.GetSingleWordInOperand(1u)) ==
             spv::Decoration::Binding)) {
          AddToWorklist(&anno);
        }
      }

      if (context()->preserve_spec_constants()) {
        // Keep all specialization constant instructions
        if (spv::Decoration(anno.GetSingleWordInOperand(1u)) ==
            spv::Decoration::SpecId) {
          AddToWorklist(&anno);
        }
      }
    }
  }

  // For each DebugInfo GlobalVariable keep all operands except the Variable.
  // Later, if the variable is killed with KillInst(), we will set the operand
  // to DebugInfoNone. Create and save DebugInfoNone now for this possible
  // later use. This is slightly unoptimal, but it avoids generating it during
  // instruction killing when the module is not consistent.
  bool debug_global_seen = false;
  for (auto& dbg : get_module()->ext_inst_debuginfo()) {
    if (dbg.GetCommonDebugOpcode() != CommonDebugInfoDebugGlobalVariable)
      continue;
    debug_global_seen = true;
    dbg.ForEachInId([this](const uint32_t* iid) {
      Instruction* in_inst = get_def_use_mgr()->GetDef(*iid);
      if (in_inst->opcode() == spv::Op::OpVariable) return;
      AddToWorklist(in_inst);
    });
  }
  if (debug_global_seen) {
    auto dbg_none = context()->get_debug_info_mgr()->GetDebugInfoNone();
    AddToWorklist(dbg_none);
  }

  // Add top level DebugInfo to worklist
  for (auto& dbg : get_module()->ext_inst_debuginfo()) {
    auto op = dbg.GetShader100DebugOpcode();
    if (op == NonSemanticShaderDebugInfo100DebugCompilationUnit ||
        op == NonSemanticShaderDebugInfo100DebugEntryPoint ||
        op == NonSemanticShaderDebugInfo100DebugSource ||
        op == NonSemanticShaderDebugInfo100DebugSourceContinued) {
      AddToWorklist(&dbg);
    }
  }
}